

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O2

void __thiscall
cmCommandArgumentsHelper::Parse
          (cmCommandArgumentsHelper *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unconsumedArgs)

{
  bool bVar1;
  pointer ppcVar2;
  cmCommandArgument *pcVar3;
  cmCommandArgument *pcVar4;
  pointer __x;
  cmCommandArgument *current;
  
  if (args != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    for (ppcVar2 = (this->Arguments).
                   super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar2 !=
        (this->Arguments).
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
      cmCommandArgument::ApplyOwnGroup(*ppcVar2);
      pcVar3 = *ppcVar2;
      pcVar3->WasActive = false;
      pcVar3->CurrentIndex = 0;
      (*pcVar3->_vptr_cmCommandArgument[3])();
    }
    current = (cmCommandArgument *)0x0;
    pcVar3 = (cmCommandArgument *)0x0;
    for (__x = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
        __x != (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
      for (ppcVar2 = (this->Arguments).
                     super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppcVar2 !=
          (this->Arguments).
          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
        bVar1 = cmCommandArgument::KeyMatches(*ppcVar2,__x);
        if ((bVar1) && (bVar1 = cmCommandArgument::MayFollow(*ppcVar2,current), bVar1)) {
          pcVar3 = *ppcVar2;
          pcVar3->WasActive = true;
          pcVar3->CurrentIndex = 0;
          goto LAB_0040205c;
        }
      }
      if (pcVar3 == (cmCommandArgument *)0x0) {
        if (unconsumedArgs !=
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(unconsumedArgs,__x);
        }
        pcVar4 = (cmCommandArgument *)0x0;
      }
      else {
LAB_0040205c:
        bVar1 = cmCommandArgument::Consume(pcVar3,__x);
        pcVar4 = (cmCommandArgument *)0x0;
        current = pcVar3;
        if (!bVar1) {
          pcVar4 = pcVar3;
        }
      }
      pcVar3 = pcVar4;
    }
  }
  return;
}

Assistant:

void cmCommandArgumentsHelper::Parse(const std::vector<std::string>* args,
                                     std::vector<std::string>* unconsumedArgs)
{
  if (args == CM_NULLPTR) {
    return;
  }

  for (std::vector<cmCommandArgument*>::iterator argIt =
         this->Arguments.begin();
       argIt != this->Arguments.end(); ++argIt) {
    (*argIt)->ApplyOwnGroup();
    (*argIt)->Reset();
  }

  cmCommandArgument* activeArgument = CM_NULLPTR;
  const cmCommandArgument* previousArgument = CM_NULLPTR;
  for (std::vector<std::string>::const_iterator it = args->begin();
       it != args->end(); ++it) {
    for (std::vector<cmCommandArgument*>::iterator argIt =
           this->Arguments.begin();
         argIt != this->Arguments.end(); ++argIt) {
      if ((*argIt)->KeyMatches(*it) &&
          ((*argIt)->MayFollow(previousArgument))) {
        activeArgument = *argIt;
        activeArgument->Activate();
        break;
      }
    }

    if (activeArgument) {
      bool argDone = activeArgument->Consume(*it);
      previousArgument = activeArgument;
      if (argDone) {
        activeArgument = CM_NULLPTR;
      }
    } else {
      if (unconsumedArgs != CM_NULLPTR) {
        unconsumedArgs->push_back(*it);
      }
    }
  }
}